

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * Fantasy_Rapunzel_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  ulong *puVar1;
  byte bVar2;
  byte *buf_00;
  ulong *puVar3;
  char *pcVar4;
  int err;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  char *mark;
  uint64_t value;
  uint16_t local_4a;
  int local_48;
  int local_44;
  uint64_t local_40;
  uint16_t *local_38;
  
  if ((buf == end) || (*buf != '{')) {
    pcVar4 = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    return pcVar4;
  }
  puVar9 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar9 < 2) {
LAB_0011b183:
    puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
  }
  else if ((char)(byte)*puVar9 < '!') {
    if (((byte)*puVar9 != 0x20) || (buf[2] < '!')) goto LAB_0011b183;
    puVar9 = (ulong *)(buf + 2);
  }
  if ((puVar9 == (ulong *)end) || ((byte)*puVar9 != 0x7d)) {
    local_44 = 1;
    puVar3 = puVar9;
    local_38 = (uint16_t *)struct_base;
    do {
      if (puVar3 != (ulong *)end) {
        if ((byte)*puVar3 == 0x2e) {
          puVar3 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar3,end,5);
        }
        else if ((byte)*puVar3 == 0x22) {
          puVar3 = (ulong *)((long)puVar3 + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      puVar9 = puVar3;
      if ((ulong)((long)end - (long)puVar3) < 8) {
        uVar7 = 0;
        uVar6 = 0;
        uVar10 = 0;
        uVar11 = 0;
        uVar13 = 0;
        uVar5 = 0;
        switch((long)end - (long)puVar3) {
        case 7:
          uVar7 = (long)(char)*(byte *)((long)puVar3 + 6) << 8;
        case 6:
          uVar6 = (long)(char)*(byte *)((long)puVar3 + 5) << 0x10 | uVar7;
        case 5:
          uVar10 = (long)(char)*(byte *)((long)puVar3 + 4) << 0x18 | uVar6;
        case 4:
          uVar11 = (long)(char)*(byte *)((long)puVar3 + 3) << 0x20 | uVar10;
        case 3:
          uVar13 = (long)(char)*(byte *)((long)puVar3 + 2) << 0x28 | uVar11;
        case 2:
          uVar5 = (long)(char)*(byte *)((long)puVar3 + 1) << 0x30 | uVar13;
        case 1:
          uVar5 = (ulong)(byte)*puVar3 << 0x38 | uVar5;
          goto LAB_0011b2b8;
        }
switchD_0011b309_default:
        puVar3 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar9,end);
      }
      else {
        uVar6 = *puVar3;
        uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
LAB_0011b2b8:
        if (uVar5 != 0x686169725f6c656e) goto switchD_0011b309_default;
        puVar1 = puVar3 + 1;
        uVar6 = (long)end - (long)puVar1;
        puVar9 = puVar1;
        if (uVar6 < 8) {
          uVar12 = 0;
          uVar14 = 0;
          uVar8 = 0;
          switch(uVar6) {
          case 7:
          case 6:
          case 5:
          case 4:
            uVar12 = (uint)(char)*(byte *)((long)puVar3 + 0xb);
          case 3:
            uVar14 = (uint)((ulong)((long)(char)*(byte *)((long)puVar3 + 10) << 0x28) >> 0x20) |
                     uVar12;
          case 2:
            uVar8 = (uint)((ulong)((long)(char)*(byte *)((long)puVar3 + 9) << 0x30) >> 0x20) |
                    uVar14;
          case 1:
            uVar8 = (uint)(((ulong)(byte)*puVar1 << 0x38) >> 0x20) | uVar8;
            break;
          default:
            goto switchD_0011b309_default;
          }
        }
        else {
          uVar5 = *puVar1;
          uVar8 = (uint)(uVar5 >> 8) & 0xff00 | (uint)(((uVar5 & 0xff00) << 0x28) >> 0x20) |
                  (uint)((uVar5 << 0x38) >> 0x20);
        }
        if ((uVar8 >> 8 != 0x677468) || ((long)uVar6 < 4)) goto switchD_0011b309_default;
        bVar2 = *(byte *)((long)puVar3 + 0xb);
        if (ctx->unquoted == 0) {
          if (bVar2 == 0x22) {
            buf_00 = (byte *)((long)puVar3 + 0xc);
            goto LAB_0011b3b0;
          }
          goto switchD_0011b309_default;
        }
        if (' ' < (char)bVar2 && bVar2 != 0x3a) goto switchD_0011b309_default;
        buf_00 = (byte *)((long)puVar3 + 0xb);
        ctx->unquoted = 0;
LAB_0011b3b0:
        if ((long)end - (long)buf_00 < 2) {
LAB_0011b3ce:
          buf_00 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
        }
        else if ((char)*buf_00 < '!') {
          if ((*buf_00 != 0x20) || ((char)buf_00[1] < '!')) goto LAB_0011b3ce;
          buf_00 = buf_00 + 1;
        }
        if ((buf_00 == (byte *)end) || (*buf_00 != 0x3a)) {
          puVar9 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,4);
        }
        else {
          puVar9 = (ulong *)(buf_00 + 1);
          if ((long)end - (long)puVar9 < 2) {
LAB_0011b41f:
            puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
          }
          else if ((char)(byte)*puVar9 < '!') {
            if (((byte)*puVar9 != 0x20) || ((char)buf_00[2] < '!')) goto LAB_0011b41f;
            puVar9 = (ulong *)(buf_00 + 2);
          }
        }
        if (puVar1 == puVar9) goto switchD_0011b309_default;
        local_40 = 0;
        local_48 = 0;
        local_4a = 0;
        puVar3 = puVar9;
        if ((puVar9 != (ulong *)end) &&
           (puVar3 = (ulong *)flatcc_json_parser_integer(ctx,(char *)puVar9,end,&local_48,&local_40)
           , puVar3 != puVar9)) {
          if (local_48 == 0) {
            if (local_40 < 0x10000) {
              local_4a = (uint16_t)local_40;
              goto LAB_0011b4e7;
            }
            err = 7;
          }
          else {
            err = 8;
          }
          puVar3 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar3,end,err);
        }
LAB_0011b4e7:
        if ((puVar9 == puVar3) &&
           ((puVar3 = (ulong *)flatcc_json_parser_symbolic_uint16
                                         (ctx,(char *)puVar3,end,
                                          Fantasy_Rapunzel_parse_json_struct_inline::
                                          symbolic_parsers,&local_4a), puVar3 == puVar9 ||
            (puVar3 == (ulong *)end)))) {
          pcVar4 = flatcc_json_parser_set_error(ctx,(char *)puVar3,end,0x23);
          return pcVar4;
        }
        *local_38 = local_4a;
      }
      puVar3 = (ulong *)flatcc_json_parser_object_end(ctx,(char *)puVar3,end,&local_44);
    } while (local_44 != 0);
  }
  else {
    puVar3 = (ulong *)((long)puVar9 + 1);
    if ((long)end - (long)puVar3 < 2) {
LAB_0011b541:
      pcVar4 = flatcc_json_parser_space_ext(ctx,(char *)puVar3,end);
      return pcVar4;
    }
    if ((char)*(byte *)puVar3 < '!') {
      if ((*(byte *)puVar3 != 0x20) || ((char)*(byte *)((long)puVar9 + 2) < '!')) goto LAB_0011b541;
      puVar3 = (ulong *)((long)puVar9 + 2);
    }
  }
  return (char *)puVar3;
}

Assistant:

static const char *Fantasy_Rapunzel_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x686169725f6c656e) { /* descend "hair_len" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xffffff0000000000) == 0x6774680000000000) { /* "gth" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_Fantasy_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_uint16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "gth" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "gth" */
        } else { /* descend "hair_len" */
            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        } /* descend "hair_len" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}